

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiply.c
# Opt level: O0

void multiply(arm7tdmi_t *state,arminstr_t *arminstr)

{
  uint uVar1;
  uint uVar2;
  status_register_t *psVar3;
  uint *in_RSI;
  arm7tdmi_t *in_RDI;
  uint32_t wordresult;
  uint64_t result;
  multiply_t *instr;
  uint32_t value_2;
  uint32_t value_1;
  uint32_t value;
  status_register_t *psr;
  undefined8 in_stack_fffffffffffffec8;
  uint32_t new_pc;
  arm7tdmi_t *in_stack_fffffffffffffed0;
  uint32_t local_d0;
  uint32_t local_c0;
  uint32_t local_b0;
  uint32_t local_6c;
  uint32_t local_5c;
  uint32_t local_4c;
  uint32_t local_3c;
  uint32_t local_2c;
  uint32_t local_20;
  
  if ((*in_RSI >> 0x10 & 0xf) == 0xf) {
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/multiply.c"
            ,7);
    fprintf(_stderr,"UNIMPLEMENTED CASE DETECTED: %s\n\x1b[0;m","rd must not be 15!");
    exit(1);
  }
  if ((*in_RSI >> 0xc & 0xf) == 0xf) {
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/multiply.c"
            ,8);
    fprintf(_stderr,"UNIMPLEMENTED CASE DETECTED: %s\n\x1b[0;m","rn must not be 15!");
    exit(1);
  }
  if ((*in_RSI >> 8 & 0xf) == 0xf) {
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/multiply.c"
            ,9);
    fprintf(_stderr,"UNIMPLEMENTED CASE DETECTED: %s\n\x1b[0;m","rs must not be 15!");
    exit(1);
  }
  if ((*in_RSI & 0xf) != 0xf) {
    uVar1 = *in_RSI & 0xf;
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar1)) && (uVar1 < 0xd)) {
      local_b0 = in_RDI->highreg_fiq[uVar1 - 8];
    }
    else if (uVar1 < 0xd) {
      local_b0 = in_RDI->r[uVar1];
    }
    else if (uVar1 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_6c = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_6c = in_RDI->sp_irq;
        break;
      case 0x13:
        local_6c = in_RDI->sp_svc;
        break;
      default:
        local_6c = in_RDI->sp;
        break;
      case 0x17:
        local_6c = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_6c = in_RDI->sp_und;
      }
      local_b0 = local_6c;
    }
    else if (uVar1 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_3c = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_3c = in_RDI->lr_irq;
        break;
      case 0x13:
        local_3c = in_RDI->lr_svc;
        break;
      default:
        local_3c = in_RDI->lr;
        break;
      case 0x17:
        local_3c = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_3c = in_RDI->lr_und;
      }
      local_b0 = local_3c;
    }
    else {
      if (uVar1 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar1);
        exit(1);
      }
      local_b0 = in_RDI->pc;
    }
    uVar1 = *in_RSI >> 8 & 0xf;
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar1)) && (uVar1 < 0xd)) {
      local_c0 = in_RDI->highreg_fiq[uVar1 - 8];
    }
    else if (uVar1 < 0xd) {
      local_c0 = in_RDI->r[uVar1];
    }
    else if (uVar1 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_5c = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_5c = in_RDI->sp_irq;
        break;
      case 0x13:
        local_5c = in_RDI->sp_svc;
        break;
      default:
        local_5c = in_RDI->sp;
        break;
      case 0x17:
        local_5c = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_5c = in_RDI->sp_und;
      }
      local_c0 = local_5c;
    }
    else if (uVar1 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_2c = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_2c = in_RDI->lr_irq;
        break;
      case 0x13:
        local_2c = in_RDI->lr_svc;
        break;
      default:
        local_2c = in_RDI->lr;
        break;
      case 0x17:
        local_2c = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_2c = in_RDI->lr_und;
      }
      local_c0 = local_2c;
    }
    else {
      if (uVar1 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar1);
        exit(1);
      }
      local_c0 = in_RDI->pc;
    }
    uVar1 = local_c0 * local_b0;
    if ((*in_RSI >> 0x15 & 1) != 0) {
      uVar2 = *in_RSI >> 0xc & 0xf;
      if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar2)) && (uVar2 < 0xd)) {
        local_d0 = in_RDI->highreg_fiq[uVar2 - 8];
      }
      else if (uVar2 < 0xd) {
        local_d0 = in_RDI->r[uVar2];
      }
      else if (uVar2 == 0xd) {
        switch((in_RDI->cpsr).raw & 0x1f) {
        case 0x11:
          local_4c = in_RDI->sp_fiq;
          break;
        case 0x12:
          local_4c = in_RDI->sp_irq;
          break;
        case 0x13:
          local_4c = in_RDI->sp_svc;
          break;
        default:
          local_4c = in_RDI->sp;
          break;
        case 0x17:
          local_4c = in_RDI->sp_abt;
          break;
        case 0x1b:
          local_4c = in_RDI->sp_und;
        }
        local_d0 = local_4c;
      }
      else if (uVar2 == 0xe) {
        switch((in_RDI->cpsr).raw & 0x1f) {
        case 0x11:
          local_20 = in_RDI->lr_fiq;
          break;
        case 0x12:
          local_20 = in_RDI->lr_irq;
          break;
        case 0x13:
          local_20 = in_RDI->lr_svc;
          break;
        default:
          local_20 = in_RDI->lr;
          break;
        case 0x17:
          local_20 = in_RDI->lr_abt;
          break;
        case 0x1b:
          local_20 = in_RDI->lr_und;
        }
        local_d0 = local_20;
      }
      else {
        if (uVar2 != 0xf) {
          fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                  "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/../arm7tdmi.h"
                  ,0xa4);
          fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar2);
          exit(1);
        }
        local_d0 = in_RDI->pc;
      }
      uVar1 = local_d0 + uVar1;
    }
    if ((*in_RSI >> 0x14 & 1) != 0) {
      psVar3 = get_psr(in_RDI);
      psVar3->raw = psVar3->raw & 0xbfffffff | (uint)(uVar1 == 0) << 0x1e;
      psVar3->raw = psVar3->raw & 0x7fffffff | (uint)((int)uVar1 < 0) << 0x1f;
    }
    uVar2 = *in_RSI >> 0x10 & 0xf;
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar2,(ulong)uVar1);
    }
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar2)) && (uVar2 < 0xd)) {
      in_RDI->highreg_fiq[uVar2 - 8] = uVar1;
    }
    else if (uVar2 < 0xd) {
      in_RDI->r[uVar2] = uVar1;
    }
    else if (uVar2 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->sp_fiq = uVar1;
        break;
      case 0x12:
        in_RDI->sp_irq = uVar1;
        break;
      case 0x13:
        in_RDI->sp_svc = uVar1;
        break;
      default:
        in_RDI->sp = uVar1;
        break;
      case 0x17:
        in_RDI->sp_abt = uVar1;
        break;
      case 0x1b:
        in_RDI->sp_und = uVar1;
      }
    }
    else if (uVar2 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->lr_fiq = uVar1;
        break;
      case 0x12:
        in_RDI->lr_irq = uVar1;
        break;
      case 0x13:
        in_RDI->lr_svc = uVar1;
        break;
      default:
        in_RDI->lr = uVar1;
        break;
      case 0x17:
        in_RDI->lr_abt = uVar1;
        break;
      case 0x1b:
        in_RDI->lr_und = uVar1;
      }
    }
    else {
      if (uVar2 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/../arm7tdmi.h"
                ,0xeb);
        fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar2);
        exit(1);
      }
      new_pc = (uint32_t)((ulong)in_stack_fffffffffffffec8 >> 0x20);
      if (((in_RDI->cpsr).raw >> 5 & 1) == 0) {
        set_pc(in_stack_fffffffffffffed0,new_pc);
      }
      else {
        set_pc(in_stack_fffffffffffffed0,new_pc);
      }
    }
    return;
  }
  fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
          "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/multiply.c"
          ,10);
  fprintf(_stderr,"UNIMPLEMENTED CASE DETECTED: %s\n\x1b[0;m","rm must not be 15!");
  exit(1);
}

Assistant:

void multiply(arm7tdmi_t* state, arminstr_t* arminstr) {
    multiply_t* instr = &arminstr->parsed.MULTIPLY;

    unimplemented(instr->rd == 15, "rd must not be 15!")
    unimplemented(instr->rn == 15, "rn must not be 15!")
    unimplemented(instr->rs == 15, "rs must not be 15!")
    unimplemented(instr->rm == 15, "rm must not be 15!")

    uint64_t result = get_register(state, instr->rm);
    result *= get_register(state, instr->rs);

    if (instr->a) {
        result += get_register(state, instr->rn);
    }

    word wordresult = result & 0xFFFFFFFF;

    if (instr->s) {
        set_flags_nz(state, wordresult);
    }

    set_register(state, instr->rd, wordresult);
}